

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_b.h
# Opt level: O2

arena_t * arena_choose(tsd_t *tsd,arena_t *arena)

{
  uint uVar1;
  arena_t *paVar2;
  uint uVar3;
  uint newind;
  
  if (arena == (arena_t *)0x0) {
    if ('\0' < tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level) {
      paVar2 = arena_get((tsdn_t *)tsd,0,true);
      return paVar2;
    }
    arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
    if (arena == (arena_t *)0x0) {
      arena = arena_choose_hard(tsd,false);
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
        paVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).arena;
        if (paVar2 == (arena_t *)0x0) {
          tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,arena);
        }
        else if (paVar2 != arena) {
          tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,arena);
        }
      }
    }
    if (percpu_arena_disabled < opt_percpu_arena) {
      uVar1 = (ncpus >> 1) + (ncpus & 1);
      if (ncpus < 2) {
        uVar1 = ncpus;
      }
      if (opt_percpu_arena != per_phycpu_arena) {
        uVar1 = ncpus;
      }
      if ((arena->base->ind < uVar1) && (&arena->last_thd->tsd != tsd)) {
        uVar1 = sched_getcpu();
        if (opt_percpu_arena != percpu_arena) {
          uVar3 = 0;
          if (ncpus >> 1 <= uVar1) {
            uVar3 = ncpus >> 1;
          }
          uVar1 = uVar1 - uVar3;
        }
        if (arena->base->ind != uVar1) {
          uVar3 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena->base->ind;
          if (uVar3 != uVar1) {
            paVar2 = arena_get((tsdn_t *)tsd,uVar1,true);
            arena_migrate(tsd,uVar3,uVar1);
            if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
              tcache_arena_reassociate
                        ((tsdn_t *)tsd,
                         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,paVar2);
            }
          }
          arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
        }
        arena->last_thd = (tsdn_t *)tsd;
      }
    }
  }
  return arena;
}

Assistant:

static inline arena_t *
arena_choose(tsd_t *tsd, arena_t *arena) {
	return arena_choose_impl(tsd, arena, false);
}